

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O3

bool __thiscall LinkedObjectFile::label_points_to_code(LinkedObjectFile *this,int label_id)

{
  pointer pLVar1;
  pointer puVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = (ulong)label_id;
  pLVar1 = (this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->labels).super__Vector_base<Label,_std::allocator<Label>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pLVar1 >> 3) * -0x3333333333333333;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    puVar2 = (this->offset_of_data_zone_by_seg).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)(long)pLVar1[uVar4].target_segment <
        (ulong)((long)(this->offset_of_data_zone_by_seg).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)puVar2 >> 2)) {
      return pLVar1[uVar4].offset < (int)(puVar2[pLVar1[uVar4].target_segment] * 4);
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

bool LinkedObjectFile::label_points_to_code(int label_id) const {
  auto& label = labels.at(label_id);
  auto data_start = int(offset_of_data_zone_by_seg.at(label.target_segment)) * 4;
  return label.offset < data_start;
}